

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O0

PSprite __thiscall
DataSourceBase::get_sprite(DataSourceBase *this,Resource res,size_t index,Color *color)

{
  bool bVar1;
  uint uVar2;
  __tuple_element_t<0UL,_tuple<shared_ptr<Sprite>,_shared_ptr<Sprite>_>_> *p_Var3;
  __tuple_element_t<1UL,_tuple<shared_ptr<Sprite>,_shared_ptr<Sprite>_>_> *p_Var4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  undefined4 in_register_00000034;
  uint *in_R8;
  PSprite PVar7;
  shared_ptr<Data::Sprite> local_98 [2];
  uint local_74;
  undefined1 local_70 [8];
  PSprite image;
  PSprite mask;
  MaskImage ms;
  Color *color_local;
  size_t index_local;
  Resource res_local;
  DataSourceBase *this_local;
  
  uVar2 = Data::get_resource_count((Resource)index);
  if (color < (Color *)(ulong)uVar2) {
    (**(code **)(*(long *)CONCAT44(in_register_00000034,res) + 0x40))
              (&mask.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (long *)CONCAT44(in_register_00000034,res),index & 0xffffffff,color);
    p_Var3 = std::get<0ul,std::shared_ptr<Data::Sprite>,std::shared_ptr<Data::Sprite>>
                       ((tuple<std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_> *)
                        &mask.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    std::shared_ptr<Data::Sprite>::shared_ptr
              ((shared_ptr<Data::Sprite> *)
               &image.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               p_Var3);
    p_Var4 = std::get<1ul,std::shared_ptr<Data::Sprite>,std::shared_ptr<Data::Sprite>>
                       ((tuple<std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_> *)
                        &mask.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    std::shared_ptr<Data::Sprite>::shared_ptr((shared_ptr<Data::Sprite> *)local_70,p_Var4);
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &image.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    if (bVar1) {
      peVar5 = std::__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&image.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
      local_74 = *in_R8;
      (*peVar5->_vptr_Sprite[10])(peVar5,(ulong)local_74);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_70);
      if (bVar1) {
        peVar5 = std::__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Data::Sprite,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&image.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
        std::shared_ptr<Data::Sprite>::shared_ptr(local_98,(shared_ptr<Data::Sprite> *)local_70);
        (*peVar5->_vptr_Sprite[0xd])(peVar5,local_98);
        std::shared_ptr<Data::Sprite>::~shared_ptr(local_98);
        std::shared_ptr<Data::Sprite>::shared_ptr
                  ((shared_ptr<Data::Sprite> *)this,
                   (shared_ptr<Data::Sprite> *)
                   &image.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      else {
        std::shared_ptr<Data::Sprite>::shared_ptr
                  ((shared_ptr<Data::Sprite> *)this,
                   (shared_ptr<Data::Sprite> *)
                   &image.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
    }
    else {
      std::shared_ptr<Data::Sprite>::shared_ptr
                ((shared_ptr<Data::Sprite> *)this,(shared_ptr<Data::Sprite> *)local_70);
    }
    std::shared_ptr<Data::Sprite>::~shared_ptr((shared_ptr<Data::Sprite> *)local_70);
    std::shared_ptr<Data::Sprite>::~shared_ptr
              ((shared_ptr<Data::Sprite> *)
               &image.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::tuple<std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>::~tuple
              ((tuple<std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_> *)
               &mask.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    _Var6._M_pi = extraout_RDX_00;
  }
  else {
    std::shared_ptr<Data::Sprite>::shared_ptr((shared_ptr<Data::Sprite> *)this,(nullptr_t)0x0);
    _Var6._M_pi = extraout_RDX;
  }
  PVar7.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi
  ;
  PVar7.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (PSprite)PVar7.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Data::PSprite
DataSourceBase::get_sprite(Data::Resource res, size_t index,
                           const Data::Sprite::Color &color) {
  if (index >= Data::get_resource_count(res)) {
    return nullptr;
  }

  Data::MaskImage ms = get_sprite_parts(res, index);
  Data::PSprite mask = std::get<0>(ms);
  Data::PSprite image = std::get<1>(ms);

  if (mask) {
    mask->fill_masked(color);
    if (image) {
      mask->blend(image);
      return mask;
    }
    return mask;
  }

  return image;
}